

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_format.cpp
# Opt level: O0

void anon_unknown.dwarf_1f40::FloatCase(void)

{
  char *expected;
  string actual;
  string f;
  string *in_stack_00000150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000158;
  char **in_stack_00000160;
  allocator local_81;
  string local_80 [32];
  char *local_60;
  string local_58 [28];
  float in_stack_ffffffffffffffc4;
  string *in_stack_ffffffffffffffc8;
  allocator local_21;
  string local_20 [32];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_20,"Real Number: %.2f",&local_21);
  std::allocator<char>::~allocator((allocator<char> *)&local_21);
  GPIO::format<float>(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
  local_60 = "Real Number: 3.14";
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"",&local_81);
  assert::are_equal<char_const*,std::__cxx11::string>
            (in_stack_00000160,in_stack_00000158,in_stack_00000150);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_20);
  return;
}

Assistant:

void FloatCase()
    {
        std::string f = "Real Number: %.2f";
        auto actual = GPIO::format(f, 3.141592f);
        auto expected = "Real Number: 3.14";

        assert::are_equal(expected, actual);
    }